

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

SpectrumTexture __thiscall
pbrt::TextureParameterDictionary::GetSpectrumTextureOrNull
          (TextureParameterDictionary *this,string *name,SpectrumType spectrumType,Allocator alloc)

{
  bool bVar1;
  size_t sVar2;
  const_reference pvVar3;
  int in_ECX;
  undefined8 in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  memory_resource *in_R8;
  Spectrum s_1;
  Spectrum s;
  RGB rgb;
  const_iterator iter;
  ParsedParameter *p;
  const_iterator __end1;
  const_iterator __begin1;
  ParsedParameterVector *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTexture,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTexture>_>_>
  *spectrumTextures;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  value_type r;
  undefined4 in_stack_ffffffffffffff14;
  value_type g;
  RGBColorSpace *in_stack_ffffffffffffff18;
  polymorphic_allocator<std::byte> *in_stack_ffffffffffffff20;
  char *local_d8;
  char *local_d0;
  SpectrumType spectrumType_00;
  TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumDirectionMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture,_pbrt::GPUSpectrumPtexTexture>
  args_1;
  char *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff68;
  LogLevel in_stack_ffffffffffffff74;
  RGB local_6c;
  _Self local_60;
  _Self local_58;
  ParsedParameter *local_50;
  const_iterator local_48;
  const_iterator local_40;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_38;
  char *local_30;
  int local_24;
  Allocator local_10;
  
  if (in_ECX == 2) {
    local_d0 = (char *)in_RSI->_M_string_length + 0x60;
  }
  else {
    if (in_ECX == 1) {
      local_d8 = (char *)in_RSI->_M_string_length + 0x30;
    }
    else {
      local_d8 = (char *)in_RSI->_M_string_length + 0x90;
    }
    local_d0 = local_d8;
  }
  local_30 = local_d0;
  local_38 = *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
               **)in_RSI;
  args_1.bits = (uint64_t)in_RDI;
  local_24 = in_ECX;
  local_10.memoryResource = in_R8;
  local_40 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
             ::begin(local_38);
  local_48 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
             ::end((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                    *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  do {
    if (local_40 == local_48) {
      SpectrumTexture::TaggedPointer
                ((SpectrumTexture *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff08);
      return (SpectrumTexture)
             (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumDirectionMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture,_pbrt::GPUSpectrumPtexTexture>
              )args_1.bits;
    }
    local_50 = *local_40;
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            in_stack_ffffffffffffff08);
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                              (char *)in_stack_ffffffffffffff08);
      if (bVar1) {
        bVar1 = pstd::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)0x4e0869);
        if (bVar1) {
          ErrorExit<std::__cxx11::string&>((FileLoc *)in_RSI,(char *)args_1.bits,in_RDI);
        }
        sVar2 = pstd::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_50->strings);
        if (sVar2 == 1) {
          local_50->lookedUp = true;
          pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_50->strings,0);
          local_58._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTexture,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTexture>_>_>
               ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTexture,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTexture>_>_>
                       *)in_stack_ffffffffffffff08,(key_type *)0x4e0904);
          local_60._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTexture,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTexture>_>_>
               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTexture,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTexture>_>_>
                      *)in_stack_ffffffffffffff08);
          bVar1 = std::operator!=(&local_58,&local_60);
          if (bVar1) {
            std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTexture>_>
            ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTexture>_>
                          *)0x4e0949);
            SpectrumTexture::SpectrumTexture
                      ((SpectrumTexture *)
                       CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       (SpectrumTexture *)in_stack_ffffffffffffff08);
            return (SpectrumTexture)
                   (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumDirectionMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture,_pbrt::GPUSpectrumPtexTexture>
                    )args_1.bits;
          }
          pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_50->strings,0);
          ErrorExit<std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((FileLoc *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     in_stack_ffffffffffffff58,in_RSI,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     args_1.bits);
        }
        ErrorExit<std::__cxx11::string&>((FileLoc *)in_RSI,(char *)args_1.bits,in_RDI);
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                              (char *)in_stack_ffffffffffffff08);
      if (bVar1) {
        sVar2 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size
                          (&local_50->floats);
        if (sVar2 != 3) {
          ErrorExit<std::__cxx11::string_const&>((FileLoc *)in_RSI,(char *)args_1.bits,in_RDI);
        }
        local_50->lookedUp = true;
        pvVar3 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           (&local_50->floats,0);
        r = *pvVar3;
        pvVar3 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           (&local_50->floats,1);
        g = *pvVar3;
        pvVar3 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           (&local_50->floats,2);
        RGB::RGB(&local_6c,r,g,*pvVar3);
        if (((local_6c.r < 0.0) || (local_6c.g < 0.0)) || (local_6c.b < 0.0)) {
          ErrorExit<std::__cxx11::string_const&>((FileLoc *)in_RSI,(char *)args_1.bits,in_RDI);
        }
        Spectrum::Spectrum((Spectrum *)0x4e0adf);
        if (local_24 == 0) {
          ParameterDictionary::ColorSpace(*(ParameterDictionary **)in_RSI);
          pstd::pmr::polymorphic_allocator<std::byte>::
          new_object<pbrt::RGBIlluminantSpectrum,pbrt::RGBColorSpace_const&,pbrt::RGB&>
                    (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(RGB *)CONCAT44(g,r));
          Spectrum::TaggedPointer<pbrt::RGBIlluminantSpectrum>
                    ((Spectrum *)CONCAT44(g,r),(RGBIlluminantSpectrum *)in_stack_ffffffffffffff08);
          Spectrum::operator=((Spectrum *)CONCAT44(g,r),(Spectrum *)in_stack_ffffffffffffff08);
        }
        else if (local_24 == 2) {
          ParameterDictionary::ColorSpace(*(ParameterDictionary **)in_RSI);
          pstd::pmr::polymorphic_allocator<std::byte>::
          new_object<pbrt::RGBUnboundedSpectrum,pbrt::RGBColorSpace_const&,pbrt::RGB&>
                    (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(RGB *)CONCAT44(g,r));
          Spectrum::TaggedPointer<pbrt::RGBUnboundedSpectrum>
                    ((Spectrum *)CONCAT44(g,r),(RGBUnboundedSpectrum *)in_stack_ffffffffffffff08);
          Spectrum::operator=((Spectrum *)CONCAT44(g,r),(Spectrum *)in_stack_ffffffffffffff08);
        }
        else {
          if (local_24 != 1) {
            LogFatal<char_const(&)[37]>
                      (in_stack_ffffffffffffff74,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64
                       ,in_stack_ffffffffffffff58,(char (*) [37])in_RSI);
          }
          if (((1.0 < local_6c.r) || (1.0 < local_6c.g)) || (1.0 < local_6c.b)) {
            ErrorExit<std::__cxx11::string_const&>((FileLoc *)in_RSI,(char *)args_1.bits,in_RDI);
          }
          ParameterDictionary::ColorSpace(*(ParameterDictionary **)in_RSI);
          pstd::pmr::polymorphic_allocator<std::byte>::
          new_object<pbrt::RGBAlbedoSpectrum,pbrt::RGBColorSpace_const&,pbrt::RGB&>
                    (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(RGB *)CONCAT44(g,r));
          Spectrum::TaggedPointer<pbrt::RGBAlbedoSpectrum>
                    ((Spectrum *)CONCAT44(g,r),(RGBAlbedoSpectrum *)in_stack_ffffffffffffff08);
          Spectrum::operator=((Spectrum *)CONCAT44(g,r),(Spectrum *)in_stack_ffffffffffffff08);
        }
        pstd::pmr::polymorphic_allocator<std::byte>::
        new_object<pbrt::SpectrumConstantTexture,pbrt::Spectrum&>
                  (in_stack_ffffffffffffff20,(Spectrum *)in_stack_ffffffffffffff18);
        SpectrumTexture::TaggedPointer<pbrt::SpectrumConstantTexture>
                  ((SpectrumTexture *)CONCAT44(g,r),
                   (SpectrumConstantTexture *)in_stack_ffffffffffffff08);
        return (SpectrumTexture)
               (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumDirectionMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture,_pbrt::GPUSpectrumPtexTexture>
                )args_1.bits;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                              (char *)in_stack_ffffffffffffff08);
      spectrumType_00 = (SpectrumType)((ulong)in_RDX >> 0x20);
      if (bVar1) {
LAB_004e0cbe:
        Spectrum::TaggedPointer
                  ((Spectrum *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff08);
        GetOneSpectrum((TextureParameterDictionary *)in_RSI,(string *)args_1.bits,(Spectrum *)in_RDI
                       ,spectrumType_00,local_10);
        bVar1 = pbrt::TaggedPointer::operator_cast_to_bool
                          ((TaggedPointer *)&stack0xffffffffffffff68);
        if (bVar1) {
          pstd::pmr::polymorphic_allocator<std::byte>::
          new_object<pbrt::SpectrumConstantTexture,pbrt::Spectrum&>
                    (in_stack_ffffffffffffff20,(Spectrum *)in_stack_ffffffffffffff18);
          SpectrumTexture::TaggedPointer<pbrt::SpectrumConstantTexture>
                    ((SpectrumTexture *)
                     CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (SpectrumConstantTexture *)in_stack_ffffffffffffff08);
          return (SpectrumTexture)
                 (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumDirectionMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture,_pbrt::GPUSpectrumPtexTexture>
                  )args_1.bits;
        }
        LogFatal<char_const(&)[2]>
                  (in_stack_ffffffffffffff74,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                   (char *)local_10.memoryResource,(char (*) [2])in_RSI);
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                              (char *)in_stack_ffffffffffffff08);
      spectrumType_00 = (SpectrumType)((ulong)in_RDX >> 0x20);
      if (bVar1) goto LAB_004e0cbe;
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

SpectrumTexture TextureParameterDictionary::GetSpectrumTextureOrNull(
    std::string name, SpectrumType spectrumType, Allocator alloc) const {
    const auto &spectrumTextures = (spectrumType == SpectrumType::Unbounded)
                                       ? textures->unboundedSpectrumTextures
                                       : ((spectrumType == SpectrumType::Albedo)
                                              ? textures->albedoSpectrumTextures
                                              : textures->illuminantSpectrumTextures);

    for (const ParsedParameter *p : dict->params) {
        if (p->name != name)
            continue;

        if (p->type == "texture") {
            if (p->strings.empty())
                ErrorExit(&p->loc, "No texture name provided for parameter \"%s\".",
                          name);
            if (p->strings.size() != 1)
                ErrorExit(&p->loc,
                          "More than one texture name provided for parameter \"%s\".",
                          name);

            p->lookedUp = true;
            auto iter = spectrumTextures.find(p->strings[0]);
            if (iter != spectrumTextures.end())
                return iter->second;

            ErrorExit(&p->loc,
                      R"(Couldn't find spectrum texture named "%s" for parameter "%s")",
                      p->strings[0], p->name);
        } else if (p->type == "rgb") {
            if (p->floats.size() != 3)
                ErrorExit(&p->loc,
                          "Didn't find three values for \"rgb\" parameter \"%s\".",
                          p->name);
            p->lookedUp = true;

            RGB rgb(p->floats[0], p->floats[1], p->floats[2]);
            if (rgb.r < 0 || rgb.g < 0 || rgb.b < 0)
                ErrorExit(&p->loc, "Negative value provided for RGB parameter \"%s\".",
                          p->name);
            Spectrum s;
            if (spectrumType == SpectrumType::Illuminant)
                s = alloc.new_object<RGBIlluminantSpectrum>(*dict->ColorSpace(), rgb);
            else if (spectrumType == SpectrumType::Unbounded)
                s = alloc.new_object<RGBUnboundedSpectrum>(*dict->ColorSpace(), rgb);
            else {
                CHECK(spectrumType == SpectrumType::Albedo);
                if (rgb.r > 1 || rgb.g > 1 || rgb.b > 1)
                    ErrorExit(&p->loc,
                              "RGB parameter \"%s\" used as an albedo has > 1 component.",
                              p->name);
                s = alloc.new_object<RGBAlbedoSpectrum>(*dict->ColorSpace(), rgb);
            }
            return alloc.new_object<SpectrumConstantTexture>(s);
        } else if (p->type == "spectrum" || p->type == "blackbody") {
            Spectrum s = GetOneSpectrum(name, nullptr, spectrumType, alloc);
            CHECK(s);
            return alloc.new_object<SpectrumConstantTexture>(s);
        }
    }

    return nullptr;
}